

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O2

void Gia_ManSatokoCall(Gia_Man_t *p,satoko_opts_t *opts,int fSplit,int fIncrem)

{
  int Var;
  uint n_vars;
  int *pvars;
  int iVar1;
  abctime aVar2;
  Cnf_Dat_t *pCnf;
  satoko_t *s;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  Vec_Int_t *p_00;
  abctime aVar5;
  char *pStr;
  Gia_Man_t *p_01;
  abctime extraout_RDX;
  abctime extraout_RDX_00;
  int iVar6;
  
  if (fIncrem == 0) {
    if (fSplit == 0) {
      Gia_ManSatokoCallOne(p,opts,-1);
      return;
    }
    aVar2 = Abc_Clock();
    for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
      pGVar3 = Gia_ManCo(p,iVar6);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      p_01 = Gia_ManDupDfsCone(p,pGVar3);
      Gia_ManSatokoCallOne(p_01,opts,iVar6);
      Gia_ManStop(p_01);
    }
    aVar4 = Abc_Clock();
    pStr = (char *)(aVar4 - aVar2);
    aVar2 = extraout_RDX_00;
  }
  else {
    aVar2 = Abc_Clock();
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,1,0);
    s = Gia_ManSatokoInit(pCnf,opts);
    iVar6 = 0;
    while (iVar6 < p->vCos->nSize) {
      pGVar3 = Gia_ManCo(p,iVar6);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      aVar4 = Abc_Clock();
      Var = iVar6 + 1;
      iVar1 = Abc_Var2Lit(Var,0);
      satoko_assump_push(s,iVar1);
      p_00 = Gia_ManCollectVars(Var,pCnf->vMapping,pCnf->nVars);
      pvars = p_00->pArray;
      n_vars = p_00->nSize;
      satoko_mark_cone(s,pvars,n_vars);
      printf("Cone has %6d vars (out of %6d).  ",(ulong)n_vars,(ulong)(uint)pCnf->nVars);
      iVar1 = satoko_solve(s);
      satoko_unmark_cone(s,pvars,n_vars);
      Vec_IntFree(p_00);
      satoko_assump_pop(s);
      aVar5 = Abc_Clock();
      Gia_ManSatokoReport(iVar6,iVar1,aVar5 - aVar4);
      iVar6 = Var;
    }
    Cnf_DataFree(pCnf);
    satoko_destroy(s);
    aVar4 = Abc_Clock();
    pStr = (char *)(aVar4 - aVar2);
    aVar2 = extraout_RDX;
  }
  Abc_PrintTime(0x79ec86,pStr,aVar2);
  return;
}

Assistant:

void Gia_ManSatokoCall( Gia_Man_t * p, satoko_opts_t * opts, int fSplit, int fIncrem )
{
    int fUseCone = 1;
    Gia_Man_t * pOne;
    Gia_Obj_t * pRoot;
    Vec_Int_t * vCone;
    int i, iLit, status;
    if ( fIncrem )
    {
        abctime clk = Abc_Clock();
        Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, fUseCone, 0 );
        satoko_t * pSat = Gia_ManSatokoInit( pCnf, opts );
        Gia_ManForEachCo( p, pRoot, i )
        {
            abctime clk = Abc_Clock();
            iLit = Abc_Var2Lit( i+1, 0 );
            satoko_assump_push( pSat, iLit );
            if ( fUseCone )
            {
                vCone = Gia_ManCollectVars( i+1, pCnf->vMapping, pCnf->nVars );
                satoko_mark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                printf( "Cone has %6d vars (out of %6d).  ", Vec_IntSize(vCone), pCnf->nVars );
                status = satoko_solve( pSat );
                satoko_unmark_cone( pSat, Vec_IntArray(vCone), Vec_IntSize(vCone) );
                Vec_IntFree( vCone );
            }
            else
            {
                status = satoko_solve( pSat );
            }
            satoko_assump_pop( pSat );
            Gia_ManSatokoReport( i, status, Abc_Clock() - clk );
        }
        Cnf_DataFree( pCnf );
        satoko_destroy( pSat );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    if ( fSplit )
    {
        abctime clk = Abc_Clock();
        Gia_ManForEachCo( p, pRoot, i )
        {
            pOne = Gia_ManDupDfsCone( p, pRoot );
            Gia_ManSatokoCallOne( pOne, opts, i );
            Gia_ManStop( pOne );
        }
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
        return;
    }
    Gia_ManSatokoCallOne( p, opts, -1 );
}